

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::OurReader::decodeUnicodeCodePoint
          (OurReader *this,Token *token,Location *current,Location end,uint *unicode)

{
  char *pcVar1;
  bool bVar2;
  allocator<char> local_91;
  String local_90;
  uint local_70 [2];
  uint surrogatePair;
  allocator<char> local_59;
  String local_58;
  uint *local_38;
  uint *unicode_local;
  Location end_local;
  Location *current_local;
  Token *token_local;
  OurReader *this_local;
  
  *unicode = 0;
  local_38 = unicode;
  unicode_local = (uint *)end;
  end_local = (Location)current;
  current_local = (Location *)token;
  token_local = (Token *)this;
  bVar2 = decodeUnicodeEscapeSequence(this,token,current,end,unicode);
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_00f7230a;
  }
  if ((0xd7ff < *local_38) && (*local_38 < 0xdc00)) {
    if ((long)unicode_local - *(long *)end_local < 6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 "additional six characters expected to parse unicode surrogate pair.",&local_59);
      this_local._7_1_ = addError(this,&local_58,(Token *)current_local,*(Location *)end_local);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      goto LAB_00f7230a;
    }
    pcVar1 = *(char **)end_local;
    *(char **)end_local = pcVar1 + 1;
    if ((*pcVar1 != '\\') ||
       (pcVar1 = *(char **)end_local, *(char **)end_local = pcVar1 + 1, *pcVar1 != 'u')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "expecting another \\u token to begin the second half of a unicode surrogate pair",
                 &local_91);
      this_local._7_1_ = addError(this,&local_90,(Token *)current_local,*(Location *)end_local);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      goto LAB_00f7230a;
    }
    bVar2 = decodeUnicodeEscapeSequence
                      (this,(Token *)current_local,(Location *)end_local,(Location)unicode_local,
                       local_70);
    if (!bVar2) {
      this_local._7_1_ = 0;
      goto LAB_00f7230a;
    }
    *local_38 = (*local_38 & 0x3ff) * 0x400 + 0x10000 + (local_70[0] & 0x3ff);
  }
  this_local._7_1_ = 1;
LAB_00f7230a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OurReader::decodeUnicodeCodePoint(Token& token, Location& current,
                                       Location end, unsigned int& unicode) {

  unicode = 0; // Convince clang-analyzer that this is initialized before use.
  if (!decodeUnicodeEscapeSequence(token, current, end, unicode))
    return false;
  if (unicode >= 0xD800 && unicode <= 0xDBFF) {
    // surrogate pairs
    if (end - current < 6)
      return addError(
          "additional six characters expected to parse unicode surrogate pair.",
          token, current);
    if (*(current++) == '\\' && *(current++) == 'u') {
      unsigned int surrogatePair;
      if (decodeUnicodeEscapeSequence(token, current, end, surrogatePair)) {
        unicode = 0x10000 + ((unicode & 0x3FF) << 10) + (surrogatePair & 0x3FF);
      } else
        return false;
    } else
      return addError("expecting another \\u token to begin the second half of "
                      "a unicode surrogate pair",
                      token, current);
  }
  return true;
}